

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_encode(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  void **ppvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  opj_tcd *poVar5;
  opj_tcd_tilecomp_t *poVar6;
  opj_image_comp_t *poVar7;
  OPJ_BOOL OVar8;
  int iVar9;
  uint uVar10;
  OPJ_SIZE_T new_size;
  OPJ_BYTE *p_src;
  opj_image_comp_t *in_RCX;
  bool bVar11;
  int iVar12;
  opj_image_t *poVar13;
  int iVar14;
  OPJ_UINT32 p_tile_index;
  long lVar15;
  opj_tcd *poVar16;
  OPJ_BYTE *pOVar17;
  OPJ_UINT32 OVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  ulong local_78;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2bea,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2beb,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2bec,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  poVar5 = p_j2k->m_tcd;
  OVar18 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
  bVar11 = true;
  if (OVar18 == 1) {
    in_RCX = (opj_image_comp_t *)poVar5->image;
    ppvVar1 = (void **)&in_RCX->x0;
    bVar11 = false;
    if ((ulong)*(uint *)ppvVar1 == 0) goto LAB_0011357f;
    in_RCX = *(opj_image_comp_t **)&in_RCX->prec;
    bVar11 = true;
    lVar15 = 0;
    do {
      if (((byte)*(code *)((long)&in_RCX->data + lVar15) & 0xf) != 0) {
        bVar11 = false;
      }
      lVar15 = lVar15 + 0x40;
    } while ((ulong)*(uint *)ppvVar1 << 6 != lVar15);
    bVar11 = !bVar11;
  }
  if (OVar18 == 0) {
    return 1;
  }
LAB_0011357f:
  p_tile_index = 0;
  local_78 = 0;
  pOVar17 = (OPJ_BYTE *)0x0;
  do {
    OVar8 = opj_j2k_pre_write_tile
                      (p_j2k,p_tile_index,(opj_stream_private_t *)p_manager,
                       (opj_event_mgr_t *)in_RCX);
    p_src = pOVar17;
    if (OVar8 == 0) {
LAB_0011398b:
      OVar8 = 0;
      goto LAB_0011398d;
    }
    poVar16 = p_j2k->m_tcd;
    if (poVar16->image->numcomps != 0) {
      lVar15 = 0x30;
      lVar21 = 0;
      uVar22 = 0;
      do {
        poVar6 = poVar5->tcd_image->tiles->comps;
        if (bVar11) {
          OVar8 = opj_alloc_tile_component_data((opj_tcd_tilecomp_t *)((long)&poVar6->x0 + lVar21));
          if (OVar8 == 0) {
            OVar8 = 0;
            opj_event_msg(p_manager,1,"Error allocating tile component data.");
            goto LAB_0011398d;
          }
          poVar16 = p_j2k->m_tcd;
        }
        else {
          in_RCX = *(opj_image_comp_t **)((long)&poVar5->image->comps->dx + lVar15);
          *(opj_image_comp_t **)((long)&poVar6->data + lVar21) = in_RCX;
          *(undefined4 *)((long)&poVar6->ownsData + lVar21) = 0;
        }
        uVar22 = uVar22 + 1;
        lVar21 = lVar21 + 0x70;
        lVar15 = lVar15 + 0x40;
      } while (uVar22 < poVar16->image->numcomps);
    }
    new_size = opj_tcd_get_encoded_tile_size(poVar16);
    if (bVar11) {
      if (local_78 < new_size) {
        p_src = (OPJ_BYTE *)opj_realloc(pOVar17,new_size);
        local_78 = new_size;
        if (p_src == (OPJ_BYTE *)0x0) {
          if (pOVar17 != (OPJ_BYTE *)0x0) {
            opj_free(pOVar17);
          }
          opj_event_msg(p_manager,1,"Not enough memory to encode all tiles\n");
          return 0;
        }
      }
      else if (pOVar17 == (OPJ_BYTE *)0x0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                      ,0x2c29,
                      "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                     );
      }
      poVar16 = p_j2k->m_tcd;
      poVar13 = poVar16->image;
      if (poVar13->numcomps != 0) {
        uVar22 = 0;
        pOVar17 = p_src;
        do {
          poVar7 = poVar13->comps;
          iVar20 = ((poVar7[uVar22].prec >> 3) + 1) - (uint)((poVar7[uVar22].prec & 7) == 0);
          if (iVar20 == 3) {
            iVar20 = 4;
          }
          lVar15 = (long)(int)poVar7[uVar22].dx;
          if ((lVar15 == 0) || (lVar21 = (long)(int)poVar7[uVar22].dy, lVar21 == 0)) {
            __assert_fail("b",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                          ,0xa2,"OPJ_INT32 opj_int_ceildiv(OPJ_INT32, OPJ_INT32)");
          }
          poVar6 = poVar16->tcd_image->tiles->comps;
          iVar2 = poVar6[uVar22].x1;
          iVar3 = poVar6[uVar22].x0;
          iVar14 = poVar6[uVar22].y0;
          iVar19 = iVar2 - iVar3;
          iVar4 = poVar6[uVar22].y1;
          iVar9 = (int)((((long)(int)poVar13->x1 - (long)(int)poVar13->x0) + lVar15 + -1) / lVar15);
          iVar12 = iVar4 - iVar14;
          uVar10 = iVar9 - iVar19;
          in_RCX = (opj_image_comp_t *)
                   (poVar7[uVar22].data +
                   (uint)((iVar14 - (int)(((int)poVar13->y0 + lVar21 + -1) / lVar21)) * iVar9 +
                         (iVar3 - (int)(((int)poVar13->x0 + lVar15 + -1) / lVar15))));
          if (iVar20 == 1) {
            if (poVar7[uVar22].sgnd == 0) {
              if (iVar4 != iVar14) {
                iVar20 = 0;
                do {
                  iVar14 = iVar19;
                  if (iVar2 != iVar3) {
                    do {
                      *pOVar17 = *(OPJ_BYTE *)&in_RCX->dx;
                      pOVar17 = pOVar17 + 1;
                      in_RCX = (opj_image_comp_t *)&in_RCX->dy;
                      iVar14 = iVar14 + -1;
                    } while (iVar14 != 0);
                  }
                  in_RCX = (opj_image_comp_t *)((long)&in_RCX->dx + (ulong)uVar10 * 4);
                  iVar20 = iVar20 + 1;
                } while (iVar20 != iVar12);
              }
            }
            else if (iVar4 != iVar14) {
              iVar20 = 0;
              do {
                iVar14 = iVar19;
                if (iVar2 != iVar3) {
                  do {
                    *pOVar17 = *(OPJ_BYTE *)&in_RCX->dx;
                    pOVar17 = pOVar17 + 1;
                    in_RCX = (opj_image_comp_t *)&in_RCX->dy;
                    iVar14 = iVar14 + -1;
                  } while (iVar14 != 0);
                }
                in_RCX = (opj_image_comp_t *)((long)&in_RCX->dx + (ulong)uVar10 * 4);
                iVar20 = iVar20 + 1;
              } while (iVar20 != iVar12);
            }
          }
          else if (iVar20 == 2) {
            if (poVar7[uVar22].sgnd == 0) {
              if (iVar4 != iVar14) {
                iVar20 = 0;
                do {
                  iVar14 = iVar19;
                  if (iVar2 != iVar3) {
                    do {
                      ppvVar1 = (void **)&in_RCX->dx;
                      in_RCX = (opj_image_comp_t *)&in_RCX->dy;
                      *(undefined2 *)pOVar17 = *(undefined2 *)ppvVar1;
                      pOVar17 = pOVar17 + 2;
                      iVar14 = iVar14 + -1;
                    } while (iVar14 != 0);
                  }
                  in_RCX = (opj_image_comp_t *)((long)&in_RCX->dx + (ulong)uVar10 * 4);
                  iVar20 = iVar20 + 1;
                } while (iVar20 != iVar12);
              }
            }
            else if (iVar4 != iVar14) {
              iVar20 = 0;
              do {
                iVar14 = iVar19;
                if (iVar2 != iVar3) {
                  do {
                    ppvVar1 = (void **)&in_RCX->dx;
                    in_RCX = (opj_image_comp_t *)&in_RCX->dy;
                    *(undefined2 *)pOVar17 = *(undefined2 *)ppvVar1;
                    pOVar17 = pOVar17 + 2;
                    iVar14 = iVar14 + -1;
                  } while (iVar14 != 0);
                }
                in_RCX = (opj_image_comp_t *)((long)&in_RCX->dx + (ulong)uVar10 * 4);
                iVar20 = iVar20 + 1;
              } while (iVar20 != iVar12);
            }
          }
          else if ((iVar20 == 4) && (iVar4 != iVar14)) {
            iVar20 = 0;
            do {
              if (iVar2 != iVar3) {
                lVar15 = 0;
                lVar21 = 0;
                do {
                  *(undefined4 *)(pOVar17 + lVar21 * 4) =
                       *(undefined4 *)((long)&in_RCX->dx + lVar21 * 4);
                  lVar21 = lVar21 + 1;
                  lVar15 = lVar15 + -4;
                } while (iVar19 != (int)lVar21);
                pOVar17 = pOVar17 + -lVar15;
                in_RCX = (opj_image_comp_t *)((long)in_RCX - lVar15);
              }
              in_RCX = (opj_image_comp_t *)((long)&in_RCX->dx + (ulong)uVar10 * 4);
              iVar20 = iVar20 + 1;
            } while (iVar20 != iVar12);
          }
          uVar22 = uVar22 + 1;
          poVar13 = poVar16->image;
        } while (uVar22 < poVar13->numcomps);
        poVar16 = p_j2k->m_tcd;
      }
      OVar8 = opj_tcd_copy_tile_data(poVar16,p_src,new_size);
      if (OVar8 == 0) {
        OVar8 = 0;
        opj_event_msg(p_manager,1,"Size mismatch between tile data and sent data.");
        goto LAB_00113992;
      }
    }
    OVar8 = opj_j2k_post_write_tile(p_j2k,p_stream,p_manager);
    if (OVar8 == 0) goto LAB_0011398b;
    p_tile_index = p_tile_index + 1;
    pOVar17 = p_src;
  } while (p_tile_index != OVar18);
  OVar8 = 1;
LAB_0011398d:
  if (p_src != (OPJ_BYTE *)0x0) {
LAB_00113992:
    opj_free(p_src);
  }
  return OVar8;
}

Assistant:

OPJ_BOOL opj_j2k_encode(opj_j2k_t * p_j2k,
                        opj_stream_private_t *p_stream,
                        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i, j;
    OPJ_UINT32 l_nb_tiles;
    OPJ_SIZE_T l_max_tile_size = 0, l_current_tile_size;
    OPJ_BYTE * l_current_data = 00;
    OPJ_BOOL l_reuse_data = OPJ_FALSE;
    opj_tcd_t* p_tcd = 00;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_stream != 00);
    assert(p_manager != 00);

    p_tcd = p_j2k->m_tcd;

    l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;
    if (l_nb_tiles == 1) {
        l_reuse_data = OPJ_TRUE;
#ifdef __SSE__
        for (j = 0; j < p_j2k->m_tcd->image->numcomps; ++j) {
            opj_image_comp_t * l_img_comp = p_tcd->image->comps + j;
            if (((size_t)l_img_comp->data & 0xFU) !=
                    0U) { /* tile data shall be aligned on 16 bytes */
                l_reuse_data = OPJ_FALSE;
            }
        }
#endif
    }
    for (i = 0; i < l_nb_tiles; ++i) {
        if (! opj_j2k_pre_write_tile(p_j2k, i, p_stream, p_manager)) {
            if (l_current_data) {
                opj_free(l_current_data);
            }
            return OPJ_FALSE;
        }

        /* if we only have one tile, then simply set tile component data equal to image component data */
        /* otherwise, allocate the data */
        for (j = 0; j < p_j2k->m_tcd->image->numcomps; ++j) {
            opj_tcd_tilecomp_t* l_tilec = p_tcd->tcd_image->tiles->comps + j;
            if (l_reuse_data) {
                opj_image_comp_t * l_img_comp = p_tcd->image->comps + j;
                l_tilec->data  =  l_img_comp->data;
                l_tilec->ownsData = OPJ_FALSE;
            } else {
                if (! opj_alloc_tile_component_data(l_tilec)) {
                    opj_event_msg(p_manager, EVT_ERROR, "Error allocating tile component data.");
                    if (l_current_data) {
                        opj_free(l_current_data);
                    }
                    return OPJ_FALSE;
                }
            }
        }
        l_current_tile_size = opj_tcd_get_encoded_tile_size(p_j2k->m_tcd);
        if (!l_reuse_data) {
            if (l_current_tile_size > l_max_tile_size) {
                OPJ_BYTE *l_new_current_data = (OPJ_BYTE *) opj_realloc(l_current_data,
                                               l_current_tile_size);
                if (! l_new_current_data) {
                    if (l_current_data) {
                        opj_free(l_current_data);
                    }
                    opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to encode all tiles\n");
                    return OPJ_FALSE;
                }
                l_current_data = l_new_current_data;
                l_max_tile_size = l_current_tile_size;
            }
            if (l_current_data == NULL) {
                /* Should not happen in practice, but will avoid Coverity to */
                /* complain about a null pointer dereference */
                assert(0);
                return OPJ_FALSE;
            }

            /* copy image data (32 bit) to l_current_data as contiguous, all-component, zero offset buffer */
            /* 32 bit components @ 8 bit precision get converted to 8 bit */
            /* 32 bit components @ 16 bit precision get converted to 16 bit */
            opj_j2k_get_tile_data(p_j2k->m_tcd, l_current_data);

            /* now copy this data into the tile component */
            if (! opj_tcd_copy_tile_data(p_j2k->m_tcd, l_current_data,
                                         l_current_tile_size)) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Size mismatch between tile data and sent data.");
                opj_free(l_current_data);
                return OPJ_FALSE;
            }
        }

        if (! opj_j2k_post_write_tile(p_j2k, p_stream, p_manager)) {
            if (l_current_data) {
                opj_free(l_current_data);
            }
            return OPJ_FALSE;
        }
    }

    if (l_current_data) {
        opj_free(l_current_data);
    }
    return OPJ_TRUE;
}